

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Io.hpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
io::readFileToString
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,string *path)

{
  long local_240;
  ifstream file;
  byte abStack_220 [200];
  undefined8 auStack_158 [36];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  std::ifstream::ifstream(&local_240,(string *)path,_S_in);
  if ((abStack_220[*(long *)(local_240 + -0x18)] & 5) == 0) {
    local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
    std::__cxx11::string::_M_construct<std::istreambuf_iterator<char,std::char_traits<char>>>
              ((string *)&local_38,*(undefined8 *)((long)auStack_158 + *(long *)(local_240 + -0x18))
               ,0xffffffffffffffff,0,0xffffffff);
    std::optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::
    optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (__return_storage_ptr__,&local_38);
    std::__cxx11::string::~string((string *)&local_38);
  }
  else {
    (__return_storage_ptr__->
    super__Optional_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false,_false>
    )._M_payload.
    super__Optional_payload<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_false,_false>
    .
    super__Optional_payload_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ._M_engaged = false;
  }
  std::ifstream::~ifstream(&local_240);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string> readFileToString(const std::string & path) {

  std::ifstream file{path};

  if (file.fail()) {
    return std::nullopt;
  }

  return std::string{std::istreambuf_iterator<char>(file), std::istreambuf_iterator<char>()};
}